

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializePromisePrototype
               (DynamicObject *promisePrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  undefined8 in_RAX;
  uint uVar4;
  JavascriptString *pJVar1;
  JavascriptMethod p_Var2;
  JavascriptFunction *pJVar3;
  ulong uVar5;
  
  uVar4 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,promisePrototype,mode,4,0);
  this = (((promisePrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this_00 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  uVar5 = (ulong)uVar4 << 0x20;
  (*(promisePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (promisePrototype,0x67,(this->super_JavascriptLibraryBase).promiseConstructor.ptr,6,0,0,
             uVar5);
  if (((this_00->config).threadConfig)->m_ES6ToStringTag == true) {
    pJVar1 = CreateStringFromCppLiteral<8ul>(this,(char16 (*) [8])L"Promise");
    uVar5 = uVar5 & 0xffffffff00000000;
    (*(promisePrototype->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (promisePrototype,0x1b,pJVar1,2,0,0,uVar5);
  }
  p_Var2 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptPromise::EntryInfo::Catch);
  pJVar3 = AddFunctionToLibraryObject
                     (this,promisePrototype,0x5e,(FunctionInfo *)JavascriptPromise::EntryInfo::Catch
                      ,1,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var2,pJVar3);
  p_Var2 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptPromise::EntryInfo::Finally);
  pJVar3 = AddFunctionToLibraryObject
                     (this,promisePrototype,0x8a,
                      (FunctionInfo *)JavascriptPromise::EntryInfo::Finally,1,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var2,pJVar3);
  pJVar3 = EnsurePromiseThenFunction(this);
  (*(promisePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (promisePrototype,0x169,pJVar3,6,0,0,uVar5 & 0xffffffff00000000);
  p_Var2 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptPromise::EntryInfo::Then);
  pJVar3 = EnsurePromiseThenFunction(this);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var2,pJVar3);
  DynamicObject::SetHasNoEnumerableProperties(promisePrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializePromisePrototype(DynamicObject* promisePrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(promisePrototype, mode, 4);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterPromise
        // so that the update is in sync with profiler
        JavascriptLibrary* library = promisePrototype->GetLibrary();
        ScriptContext* scriptContext = promisePrototype->GetScriptContext();

        library->AddMember(promisePrototype, PropertyIds::constructor, library->promiseConstructor);
        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(promisePrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("Promise")), PropertyConfigurable);
        }
        scriptContext->SetBuiltInLibraryFunction(JavascriptPromise::EntryInfo::Catch.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(promisePrototype, PropertyIds::catch_, &JavascriptPromise::EntryInfo::Catch, 1));

        scriptContext->SetBuiltInLibraryFunction(JavascriptPromise::EntryInfo::Finally.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(promisePrototype, PropertyIds::finally, &JavascriptPromise::EntryInfo::Finally, 1));

        library->AddMember(promisePrototype, PropertyIds::then, library->EnsurePromiseThenFunction(), PropertyBuiltInMethodDefaults);
        scriptContext->SetBuiltInLibraryFunction(JavascriptPromise::EntryInfo::Then.GetOriginalEntryPoint(), library->EnsurePromiseThenFunction());

        promisePrototype->SetHasNoEnumerableProperties(true);

        return true;
    }